

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O1

void __thiscall
Diligent::DearchiverBase::NamedResourceCache<Diligent::IPipelineResourceSignature>::Set
          (NamedResourceCache<Diligent::IPipelineResourceSignature> *this,ResourceType Type,
          char *Name,IPipelineResourceSignature *pResource)

{
  string msg;
  unique_lock<std::mutex> Lock;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_48;
  IPipelineResourceSignature *local_38;
  unique_lock<std::mutex> local_30;
  
  local_38 = pResource;
  if ((Name == (char *)0x0) || (*Name == '\0')) {
    FormatString<char[26],char[35]>
              ((string *)local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Name != nullptr && Name[0] != \'\\0\'",(char (*) [35])pResource);
    pResource = (IPipelineResourceSignature *)0xac;
    DebugAssertionFailed
              ((Char *)CONCAT44(local_58._4_4_,local_58._0_4_),"Set",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0xac);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_58._4_4_,local_58._0_4_) != &aStack_48) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_58._4_4_,local_58._0_4_),aStack_48._M_allocated_capacity + 1
                     );
    }
  }
  if (local_38 == (IPipelineResourceSignature *)0x0) {
    FormatString<char[26],char[21]>
              ((string *)local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pResource != nullptr",(char (*) [21])pResource);
    DebugAssertionFailed
              ((Char *)CONCAT44(local_58._4_4_,local_58._0_4_),"Set",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0xad);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_58._4_4_,local_58._0_4_) != &aStack_48) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_58._4_4_,local_58._0_4_),aStack_48._M_allocated_capacity + 1
                     );
    }
  }
  local_30._M_owns = false;
  local_30._M_device = &this->m_Mtx;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  local_58._0_4_ = Type;
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)(local_58 + 8),Name,true);
  std::
  _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::RefCntWeakPtr<Diligent::IPipelineResourceSignature>>,std::allocator<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::RefCntWeakPtr<Diligent::IPipelineResourceSignature>>>,std::__detail::_Select1st,std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<Diligent::DeviceObjectArchive::NamedResourceKey,Diligent::IPipelineResourceSignature*&>
            ((_Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::RefCntWeakPtr<Diligent::IPipelineResourceSignature>>,std::allocator<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::RefCntWeakPtr<Diligent::IPipelineResourceSignature>>>,std::__detail::_Select1st,std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->m_Map,local_58,&local_38);
  if (((void *)local_58._8_8_ != (void *)0x0) && ((long)aStack_48._M_allocated_capacity < 0)) {
    operator_delete__((void *)local_58._8_8_);
  }
  local_58._8_8_ = 0;
  aStack_48._M_allocated_capacity = 0;
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return;
}

Assistant:

void DearchiverBase::NamedResourceCache<ResType>::Set(ResourceType Type, const char* Name, ResType* pResource)
{
    VERIFY_EXPR(Name != nullptr && Name[0] != '\0');
    VERIFY_EXPR(pResource != nullptr);

    std::unique_lock<std::mutex> Lock{m_Mtx};
    m_Map.emplace(NamedResourceKey{Type, Name, /*CopyName = */ true}, pResource);
}